

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 556_reverseWordsInAString.cpp
# Opt level: O3

string * reverseWords(string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  pointer pcVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  string *in_RDI;
  pointer pcVar10;
  long lVar11;
  
  uVar8 = s->_M_string_length;
  if (uVar8 != 0) {
    iVar9 = 0;
    uVar4 = 0;
    do {
      pcVar6 = (s->_M_dataplus)._M_p;
      if (pcVar6[uVar4] == ' ') {
        lVar11 = (long)iVar9;
        iVar9 = (int)uVar4;
        pcVar10 = pcVar6 + (long)iVar9 + -1;
        if (pcVar6 + lVar11 < pcVar10 && iVar9 != lVar11) {
          pcVar5 = pcVar6 + lVar11;
          do {
            pcVar7 = pcVar5 + 1;
            cVar2 = *pcVar5;
            *pcVar5 = *pcVar10;
            *pcVar10 = cVar2;
            pcVar10 = pcVar10 + -1;
            pcVar5 = pcVar7;
          } while (pcVar7 < pcVar10);
          uVar8 = s->_M_string_length;
        }
        iVar9 = iVar9 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar8);
    uVar4 = (ulong)iVar9;
    pcVar6 = (s->_M_dataplus)._M_p;
    if ((uVar8 == uVar4) || (pcVar10 = pcVar6 + (uVar8 - 1), pcVar10 <= pcVar6 + uVar4))
    goto LAB_001012c4;
    pcVar5 = pcVar6 + uVar4;
    do {
      pcVar7 = pcVar5 + 1;
      cVar2 = *pcVar5;
      *pcVar5 = *pcVar10;
      *pcVar10 = cVar2;
      pcVar10 = pcVar10 + -1;
      pcVar5 = pcVar7;
    } while (pcVar7 < pcVar10);
  }
  pcVar6 = (s->_M_dataplus)._M_p;
LAB_001012c4:
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar3;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar6;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

string reverseWords(string s) {
    int begin=0,end=-1;
    for (size_t i=0;i<s.size();i++)
    {
        if (s[i]==' ')
        {
            end = i;
            reverse(s.begin()+begin,s.begin()+end);
            begin = end+1;
        }
    }
    reverse(s.begin()+begin,s.end());
    return s;
}